

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

arg_info * __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  bool bVar1;
  arg_info *ret;
  
  ret = (this->head_)._M_b._M_p;
  do {
    while (((ulong)ret & 0xffffffffffff) == 0) {
      allocate(this);
      ret = (this->head_)._M_b._M_p;
    }
    bVar1 = std::atomic<depspawn::internal::arg_info_*>::compare_exchange_weak
                      (&this->head_,&ret,
                       (__pointer_type)
                       ((*(ulong *)(((ulong)ret & 0xffffffffffff) + 0x18) & 0xffffffffffff) +
                        ((ulong)ret & 0xffff000000000000 | 0xffffffffffff) + 1),memory_order_seq_cst
                      );
  } while (!bVar1);
  return (arg_info *)((ulong)ret & 0xffffffffffff);
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }